

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O0

void __thiscall
cmCursesMainForm::Render(cmCursesMainForm *this,int left,int top,int width,int height)

{
  bool bVar1;
  CacheEntryType CVar2;
  FIELD *field;
  cmCursesStringWidget *this_00;
  size_type sVar3;
  pointer pcVar4;
  cmState *pcVar5;
  char *pcVar6;
  pointer pcVar7;
  pointer pcVar8;
  fieldnode **fields;
  FORM *pFVar9;
  int iVar10;
  int iVar11;
  int local_234;
  bool local_222;
  int page;
  int row;
  allocator<char> local_159;
  string local_158;
  byte local_132;
  allocator<char> local_131;
  undefined1 local_130 [6];
  bool advanced_1;
  cmValue local_110;
  cmValue existingValue_1;
  cmCursesCacheEntryComposite *entry_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_> *__range2_1;
  int i;
  bool isNewPage;
  allocator<char> local_b9;
  string local_b8;
  byte local_95;
  bool advanced;
  allocator<char> local_81;
  string local_80;
  cmValue local_60;
  cmValue existingValue;
  cmCursesCacheEntryComposite *entry;
  iterator __end2;
  iterator __begin2;
  vector<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_> *__range2;
  cmCursesStringWidget *sw;
  cmCursesWidget *cw;
  FIELD *currentField;
  int height_local;
  int width_local;
  int top_local;
  int left_local;
  cmCursesMainForm *this_local;
  
  if ((this->super_cmCursesForm).Form != (FORM *)0x0) {
    field = current_field((this->super_cmCursesForm).Form);
    this_00 = (cmCursesStringWidget *)field_userptr(field);
    CVar2 = cmCursesWidget::GetType((cmCursesWidget *)this_00);
    if (((CVar2 == STRING) ||
        (CVar2 = cmCursesWidget::GetType((cmCursesWidget *)this_00), CVar2 == PATH)) ||
       (CVar2 = cmCursesWidget::GetType((cmCursesWidget *)this_00), CVar2 == FILEPATH)) {
      cmCursesStringWidget::SetInEdit(this_00,false);
    }
    unpost_form((this->super_cmCursesForm).Form);
    free_form((this->super_cmCursesForm).Form);
    (this->super_cmCursesForm).Form = (FORM *)0x0;
  }
  if (((0x40 < width) && (this->InitialWidth <= width)) && (5 < height)) {
    iVar10 = height + -7;
    if ((this->AdvancedMode & 1U) == 0) {
      this->NumberOfVisibleEntries = 0;
      __end2 = std::
               vector<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>::
               begin(&this->Entries);
      entry = (cmCursesCacheEntryComposite *)
              std::vector<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>
              ::end(&this->Entries);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<cmCursesCacheEntryComposite_*,_std::vector<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>_>
                                         *)&entry), bVar1) {
        existingValue.Value =
             (string *)
             __gnu_cxx::
             __normal_iterator<cmCursesCacheEntryComposite_*,_std::vector<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>_>
             ::operator*(&__end2);
        pcVar4 = std::unique_ptr<cmake,_std::default_delete<cmake>_>::operator->
                           (&this->CMakeInstance);
        pcVar5 = cmake::GetState(pcVar4);
        pcVar6 = cmCursesCacheEntryComposite::GetValue
                           ((cmCursesCacheEntryComposite *)existingValue.Value);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,pcVar6,&local_81);
        local_60 = cmState::GetCacheEntryValue(pcVar5,&local_80);
        std::__cxx11::string::~string((string *)&local_80);
        std::allocator<char>::~allocator(&local_81);
        pcVar4 = std::unique_ptr<cmake,_std::default_delete<cmake>_>::operator->
                           (&this->CMakeInstance);
        pcVar5 = cmake::GetState(pcVar4);
        pcVar6 = cmCursesCacheEntryComposite::GetValue
                           ((cmCursesCacheEntryComposite *)existingValue.Value);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,pcVar6,&local_b9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&i,"ADVANCED",(allocator<char> *)((long)&__range2_1 + 7));
        bVar1 = cmState::GetCacheEntryPropertyAsBool(pcVar5,&local_b8,(string *)&i);
        std::__cxx11::string::~string((string *)&i);
        std::allocator<char>::~allocator((allocator<char> *)((long)&__range2_1 + 7));
        std::__cxx11::string::~string((string *)&local_b8);
        std::allocator<char>::~allocator(&local_b9);
        local_95 = bVar1;
        bVar1 = cmValue::operator_cast_to_bool(&local_60);
        if ((bVar1) && (((this->AdvancedMode & 1U) != 0 || ((local_95 & 1) == 0)))) {
          this->NumberOfVisibleEntries = this->NumberOfVisibleEntries + 1;
        }
        __gnu_cxx::
        __normal_iterator<cmCursesCacheEntryComposite_*,_std::vector<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>_>
        ::operator++(&__end2);
      }
    }
    else {
      sVar3 = std::vector<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>
              ::size(&this->Entries);
      this->NumberOfVisibleEntries = sVar3;
    }
    this->NumberOfPages = 1;
    if (0 < iVar10) {
      __range2_1._0_4_ = 0;
      __end2_1 = std::
                 vector<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>::
                 begin(&this->Entries);
      entry_1 = (cmCursesCacheEntryComposite *)
                std::
                vector<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>::
                end(&this->Entries);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<cmCursesCacheEntryComposite_*,_std::vector<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>_>
                                 *)&entry_1), bVar1) {
        existingValue_1.Value =
             (string *)
             __gnu_cxx::
             __normal_iterator<cmCursesCacheEntryComposite_*,_std::vector<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>_>
             ::operator*(&__end2_1);
        pcVar4 = std::unique_ptr<cmake,_std::default_delete<cmake>_>::operator->
                           (&this->CMakeInstance);
        pcVar5 = cmake::GetState(pcVar4);
        pcVar6 = cmCursesCacheEntryComposite::GetValue
                           ((cmCursesCacheEntryComposite *)existingValue_1.Value);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)local_130,pcVar6,&local_131);
        local_110 = cmState::GetCacheEntryValue(pcVar5,(string *)local_130);
        std::__cxx11::string::~string((string *)local_130);
        std::allocator<char>::~allocator(&local_131);
        pcVar4 = std::unique_ptr<cmake,_std::default_delete<cmake>_>::operator->
                           (&this->CMakeInstance);
        pcVar5 = cmake::GetState(pcVar4);
        pcVar6 = cmCursesCacheEntryComposite::GetValue
                           ((cmCursesCacheEntryComposite *)existingValue_1.Value);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,pcVar6,&local_159);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&row,"ADVANCED",(allocator<char> *)((long)&page + 3));
        bVar1 = cmState::GetCacheEntryPropertyAsBool(pcVar5,&local_158,(string *)&row);
        std::__cxx11::string::~string((string *)&row);
        std::allocator<char>::~allocator((allocator<char> *)((long)&page + 3));
        std::__cxx11::string::~string((string *)&local_158);
        std::allocator<char>::~allocator(&local_159);
        local_132 = bVar1;
        bVar1 = cmValue::operator_cast_to_bool(&local_110);
        if ((bVar1) && (((this->AdvancedMode & 1U) != 0 || ((local_132 & 1) == 0)))) {
          iVar11 = (int)__range2_1 % iVar10 + 1;
          bVar1 = 1 < (int)__range2_1 / iVar10 + 1;
          local_222 = bVar1 && iVar11 == 1;
          __range2_1._6_1_ = local_222;
          if (bVar1 && iVar11 == 1) {
            this->NumberOfPages = this->NumberOfPages + 1;
          }
          pcVar7 = std::unique_ptr<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>::
                   operator->((unique_ptr<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>
                               *)existingValue_1.Value);
          (*(pcVar7->super_cmCursesWidget)._vptr_cmCursesWidget[3])
                    (pcVar7,(ulong)(uint)left,(ulong)((top + iVar11) - 1),
                     (ulong)(__range2_1._6_1_ & 1));
          pcVar7 = std::unique_ptr<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>::
                   operator->((unique_ptr<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>
                               *)&(existingValue_1.Value)->_M_string_length);
          (*(pcVar7->super_cmCursesWidget)._vptr_cmCursesWidget[3])
                    (pcVar7,(ulong)(left + 0x20),(ulong)((top + iVar11) - 1),0);
          pcVar8 = std::unique_ptr<cmCursesWidget,_std::default_delete<cmCursesWidget>_>::operator->
                             ((unique_ptr<cmCursesWidget,_std::default_delete<cmCursesWidget>_> *)
                              &((existingValue_1.Value)->field_2)._M_allocated_capacity);
          (*pcVar8->_vptr_cmCursesWidget[3])
                    (pcVar8,(ulong)(left + 0x21),(ulong)((top + iVar11) - 1),0);
          pcVar8 = std::unique_ptr<cmCursesWidget,_std::default_delete<cmCursesWidget>_>::operator->
                             ((unique_ptr<cmCursesWidget,_std::default_delete<cmCursesWidget>_> *)
                              &((existingValue_1.Value)->field_2)._M_allocated_capacity);
          cmCursesWidget::SetPage(pcVar8,this->NumberOfPages);
          __range2_1._0_4_ = (int)__range2_1 + 1;
        }
        __gnu_cxx::
        __normal_iterator<cmCursesCacheEntryComposite_*,_std::vector<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>_>
        ::operator++(&__end2_1);
      }
    }
    fields = std::vector<fieldnode_*,_std::allocator<fieldnode_*>_>::data(&this->Fields);
    pFVar9 = new_form(fields);
    (this->super_cmCursesForm).Form = pFVar9;
    post_form((this->super_cmCursesForm).Form);
    (*(this->super_cmCursesForm)._vptr_cmCursesForm[4])();
    PrintKeys(this,0);
    if (_stdscr == 0) {
      local_234 = -1;
    }
    else {
      local_234 = *(short *)(_stdscr + 4) + 1;
    }
    wtouchln(_stdscr,0,local_234,1);
    refresh();
  }
  return;
}

Assistant:

void cmCursesMainForm::Render(int left, int top, int width, int height)
{

  if (this->Form) {
    FIELD* currentField = current_field(this->Form);
    cmCursesWidget* cw =
      reinterpret_cast<cmCursesWidget*>(field_userptr(currentField));
    // If in edit mode, get out of it
    if (cw->GetType() == cmStateEnums::STRING ||
        cw->GetType() == cmStateEnums::PATH ||
        cw->GetType() == cmStateEnums::FILEPATH) {
      cmCursesStringWidget* sw = static_cast<cmCursesStringWidget*>(cw);
      sw->SetInEdit(false);
    }
    // Delete the previous form
    unpost_form(this->Form);
    free_form(this->Form);
    this->Form = nullptr;
  }

  // Wrong window size
  if (width < cmCursesMainForm::MIN_WIDTH || width < this->InitialWidth ||
      height < cmCursesMainForm::MIN_HEIGHT) {
    return;
  }

  // Leave room for toolbar
  height -= 7;

  if (this->AdvancedMode) {
    this->NumberOfVisibleEntries = this->Entries.size();
  } else {
    // If normal, display only non-advanced entries
    this->NumberOfVisibleEntries = 0;
    for (cmCursesCacheEntryComposite& entry : this->Entries) {
      cmValue existingValue =
        this->CMakeInstance->GetState()->GetCacheEntryValue(entry.GetValue());
      bool advanced =
        this->CMakeInstance->GetState()->GetCacheEntryPropertyAsBool(
          entry.GetValue(), "ADVANCED");
      if (!existingValue || (!this->AdvancedMode && advanced)) {
        continue;
      }
      this->NumberOfVisibleEntries++;
    }
  }

  // Re-adjust the fields according to their place
  this->NumberOfPages = 1;
  if (height > 0) {
    bool isNewPage;
    int i = 0;
    for (cmCursesCacheEntryComposite& entry : this->Entries) {
      cmValue existingValue =
        this->CMakeInstance->GetState()->GetCacheEntryValue(entry.GetValue());
      bool advanced =
        this->CMakeInstance->GetState()->GetCacheEntryPropertyAsBool(
          entry.GetValue(), "ADVANCED");
      if (!existingValue || (!this->AdvancedMode && advanced)) {
        continue;
      }
      int row = (i % height) + 1;
      int page = (i / height) + 1;
      isNewPage = (page > 1) && (row == 1);

      if (isNewPage) {
        this->NumberOfPages++;
      }
      entry.Label->Move(left, top + row - 1, isNewPage);
      entry.IsNewLabel->Move(left + 32, top + row - 1, false);
      entry.Entry->Move(left + 33, top + row - 1, false);
      entry.Entry->SetPage(this->NumberOfPages);
      i++;
    }
  }

  // Post the form
  this->Form = new_form(this->Fields.data());
  post_form(this->Form);
  // Update toolbar
  this->UpdateStatusBar();
  this->PrintKeys();

  touchwin(stdscr);
  refresh();
}